

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extension_set.cc
# Opt level: O0

string * __thiscall
google::protobuf::internal::ExtensionSet::AddString_abi_cxx11_
          (ExtensionSet *this,int number,FieldType type,FieldDescriptor *descriptor)

{
  Rep *this_00;
  bool bVar1;
  CppType CVar2;
  RepeatedPtrField<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *pRVar3;
  LogMessage *pLVar4;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar5;
  LogFinisher local_14a;
  byte local_149;
  LogMessage local_148;
  LogFinisher local_10a;
  byte local_109;
  LogMessage local_108;
  LogFinisher local_cd [20];
  byte local_b9;
  LogMessage local_b8;
  Extension *local_80;
  Extension *extension;
  FieldDescriptor *descriptor_local;
  FieldType type_local;
  ExtensionSet *pEStack_68;
  int number_local;
  ExtensionSet *this_local;
  Rep *local_50;
  RepeatedPtrField<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *local_48;
  RepeatedPtrField<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_40;
  RepeatedPtrField<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *local_28;
  RepeatedPtrField<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *t;
  byte local_11;
  Rep *local_10;
  
  extension = (Extension *)descriptor;
  descriptor_local._3_1_ = type;
  descriptor_local._4_4_ = number;
  pEStack_68 = this;
  bVar1 = MaybeNewExtension(this,number,descriptor,&local_80);
  if (bVar1) {
    local_80->type = descriptor_local._3_1_;
    CVar2 = anon_unknown_29::cpp_type(local_80->type);
    local_b9 = 0;
    if (CVar2 != CPPTYPE_STRING) {
      LogMessage::LogMessage
                (&local_b8,LOGLEVEL_DFATAL,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/deps/protobuf/src/google/protobuf/extension_set.cc"
                 ,0x211);
      local_b9 = 1;
      pLVar4 = LogMessage::operator<<
                         (&local_b8,
                          "CHECK failed: (cpp_type(extension->type)) == (WireFormatLite::CPPTYPE_STRING): "
                         );
      LogFinisher::operator=(local_cd,pLVar4);
    }
    if ((local_b9 & 1) != 0) {
      LogMessage::~LogMessage(&local_b8);
    }
    local_80->is_repeated = true;
    local_80->is_packed = false;
    this_00 = (Rep *)this->arena_;
    local_50 = this_00;
    if (this_00 == (Rep *)0x0) {
      pRVar3 = (RepeatedPtrField<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                *)operator_new(0x18);
      RepeatedPtrField<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::RepeatedPtrField(pRVar3);
      local_48 = pRVar3;
    }
    else {
      local_40.super_RepeatedPtrFieldBase.current_size_ = 0;
      local_40.super_RepeatedPtrFieldBase.total_size_ = 0;
      local_40.super_RepeatedPtrFieldBase.rep_ = this_00;
      local_11 = Arena::SkipDeleteList<google::protobuf::RepeatedPtrField<std::__cxx11::string>>(0);
      t = &local_40;
      local_40.super_RepeatedPtrFieldBase.arena_ = (Arena *)this_00;
      local_10 = this_00;
      pRVar3 = (RepeatedPtrField<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                *)Arena::AllocateAligned
                            ((Arena *)this_00,
                             (type_info *)&RepeatedPtrField<std::__cxx11::string>::typeinfo,0x18);
      RepeatedPtrField<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::RepeatedPtrField(pRVar3,(t->super_RepeatedPtrFieldBase).arena_);
      local_28 = pRVar3;
      if ((local_11 & 1) == 0) {
        Arena::AddListNode((Arena *)this_00,pRVar3,
                           arena_destruct_object<google::protobuf::RepeatedPtrField<std::__cxx11::string>>
                          );
      }
      local_48 = local_28;
    }
    (local_80->field_0).repeated_string_value = local_48;
  }
  else {
    local_109 = 0;
    if ((local_80->is_repeated & 1U) == 0) {
      LogMessage::LogMessage
                (&local_108,LOGLEVEL_DFATAL,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/deps/protobuf/src/google/protobuf/extension_set.cc"
                 ,0x217);
      local_109 = 1;
      pLVar4 = LogMessage::operator<<
                         (&local_108,
                          "CHECK failed: ((*extension).is_repeated ? REPEATED : OPTIONAL) == (REPEATED): "
                         );
      LogFinisher::operator=(&local_10a,pLVar4);
    }
    if ((local_109 & 1) != 0) {
      LogMessage::~LogMessage(&local_108);
    }
    CVar2 = anon_unknown_29::cpp_type(local_80->type);
    local_149 = 0;
    if (CVar2 != CPPTYPE_STRING) {
      LogMessage::LogMessage
                (&local_148,LOGLEVEL_DFATAL,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/deps/protobuf/src/google/protobuf/extension_set.cc"
                 ,0x217);
      local_149 = 1;
      pLVar4 = LogMessage::operator<<
                         (&local_148,
                          "CHECK failed: (cpp_type((*extension).type)) == (WireFormatLite::CPPTYPE_STRING): "
                         );
      LogFinisher::operator=(&local_14a,pLVar4);
    }
    if ((local_149 & 1) != 0) {
      LogMessage::~LogMessage(&local_148);
    }
  }
  pbVar5 = RepeatedPtrField<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           ::Add((local_80->field_0).repeated_string_value);
  return pbVar5;
}

Assistant:

string* ExtensionSet::AddString(int number, FieldType type,
                                const FieldDescriptor* descriptor) {
  Extension* extension;
  if (MaybeNewExtension(number, descriptor, &extension)) {
    extension->type = type;
    GOOGLE_DCHECK_EQ(cpp_type(extension->type), WireFormatLite::CPPTYPE_STRING);
    extension->is_repeated = true;
    extension->is_packed = false;
    extension->repeated_string_value =
        Arena::CreateMessage<RepeatedPtrField<string> >(arena_);
  } else {
    GOOGLE_DCHECK_TYPE(*extension, REPEATED, STRING);
  }
  return extension->repeated_string_value->Add();
}